

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_negsol.c
# Opt level: O0

int main(void)

{
  undefined4 uVar1;
  int iVar2;
  undefined4 uVar3;
  long *plVar4;
  long *plVar5;
  undefined8 uVar6;
  sunrealtype t_00;
  int check_negative;
  int iout;
  int retval;
  void *cvode_mem;
  SUNLinearSolver LS;
  SUNMatrix A;
  N_Vector abstol;
  N_Vector y;
  sunrealtype tout;
  sunrealtype t;
  SUNContext sunctx;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  void *pvVar7;
  double local_20;
  undefined1 local_18 [8];
  void *in_stack_fffffffffffffff0;
  int local_4;
  
  pvVar7 = (void *)0x0;
  uVar1 = SUNContext_Create(0,&stack0xfffffffffffffff0);
  iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                       in_stack_ffffffffffffffac);
  if (iVar2 == 0) {
    plVar4 = (long *)N_VNew_Serial(3,in_stack_fffffffffffffff0);
    iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                         in_stack_ffffffffffffffac);
    if (iVar2 == 0) {
      **(undefined8 **)(*plVar4 + 0x10) = 0x3ff0000000000000;
      *(undefined8 *)(*(long *)(*plVar4 + 0x10) + 8) = 0;
      *(undefined8 *)(*(long *)(*plVar4 + 0x10) + 0x10) = 0;
      plVar5 = (long *)N_VNew_Serial(3,in_stack_fffffffffffffff0);
      iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffac);
      if (iVar2 == 0) {
        **(undefined8 **)(*plVar5 + 0x10) = 0x3e7ad7f29abcaf48;
        *(undefined8 *)(*(long *)(*plVar5 + 0x10) + 8) = 0x3d3c25c268497682;
        *(undefined8 *)(*(long *)(*plVar5 + 0x10) + 0x10) = 0x3ee4f8b588e368f1;
        pvVar7 = (void *)CVodeCreate(2,in_stack_fffffffffffffff0);
        iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
        if (iVar2 == 0) {
          uVar1 = CVodeInit(0,pvVar7,f,plVar4);
          iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                               in_stack_ffffffffffffffac);
          if (iVar2 == 0) {
            uVar1 = CVodeSVtolerances(0x3f1a36e2eb1c432d,pvVar7,plVar5);
            iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                 in_stack_ffffffffffffffac);
            if (iVar2 == 0) {
              uVar1 = CVodeSetUserData(pvVar7,&stack0xffffffffffffffac);
              iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                   in_stack_ffffffffffffffac);
              if (iVar2 == 0) {
                uVar6 = SUNDenseMatrix(3,3,in_stack_fffffffffffffff0);
                iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                     in_stack_ffffffffffffffac);
                if (iVar2 == 0) {
                  t_00 = (sunrealtype)SUNLinSol_Dense(plVar4,uVar6,in_stack_fffffffffffffff0);
                  iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                       in_stack_ffffffffffffffac);
                  if (iVar2 == 0) {
                    uVar1 = CVodeSetLinearSolver(pvVar7,t_00,uVar6);
                    iVar2 = check_retval(pvVar7,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffb0),
                                         in_stack_ffffffffffffffac);
                    if (iVar2 == 0) {
                      printf("Ignore negative solution components\n\n");
                      uVar1 = 0;
                      iVar2 = 0;
                      local_20 = 0.4;
                      do {
                        uVar3 = CVode(local_20,pvVar7,plVar4,local_18,1);
                        PrintOutput(t_00,(sunrealtype)pvVar7,(sunrealtype)CONCAT44(uVar3,iVar2),
                                    (sunrealtype)CONCAT44(uVar1,in_stack_ffffffffffffffa8));
                        iVar2 = iVar2 + 1;
                        local_20 = local_20 * 10.0;
                      } while (iVar2 != 0xe);
                      PrintFinalStats(in_stack_fffffffffffffff0);
                      printf("Intercept negative solution components\n\n");
                      uVar3 = 1;
                      **(undefined8 **)(*plVar4 + 0x10) = 0x3ff0000000000000;
                      *(undefined8 *)(*(long *)(*plVar4 + 0x10) + 8) = 0;
                      *(undefined8 *)(*(long *)(*plVar4 + 0x10) + 0x10) = 0;
                      uVar1 = CVodeReInit(0,pvVar7,plVar4);
                      iVar2 = 0;
                      local_20 = 0.4;
                      do {
                        CVode(local_20,pvVar7,plVar4,local_18,1);
                        PrintOutput(t_00,(sunrealtype)pvVar7,(sunrealtype)CONCAT44(uVar1,iVar2),
                                    (sunrealtype)CONCAT44(uVar3,in_stack_ffffffffffffffa8));
                        iVar2 = iVar2 + 1;
                        local_20 = local_20 * 10.0;
                      } while (iVar2 != 0xe);
                      PrintFinalStats(in_stack_fffffffffffffff0);
                      N_VDestroy(plVar4);
                      N_VDestroy(plVar5);
                      CVodeFree(&stack0xffffffffffffffb8);
                      SUNLinSolFree(t_00);
                      SUNMatDestroy(uVar6);
                      SUNContext_Free(&stack0xfffffffffffffff0);
                      local_4 = 0;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  SUNContext sunctx;
  sunrealtype t, tout;
  N_Vector y;
  N_Vector abstol;
  SUNMatrix A;
  SUNLinearSolver LS;
  void* cvode_mem;
  int retval, iout;
  sunbooleantype check_negative;

  y         = NULL;
  abstol    = NULL;
  A         = NULL;
  LS        = NULL;
  cvode_mem = NULL;

  /* Create the SUNDIALS context */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial conditions */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }

  /* Initialize y */
  NV_Ith_S(y, 0) = Y1;
  NV_Ith_S(y, 1) = Y2;
  NV_Ith_S(y, 2) = Y3;

  /* Set the vector absolute tolerance */
  abstol = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)abstol, "N_VNew_Serial", 0)) { return (1); }

  NV_Ith_S(abstol, 0) = ATOL1;
  NV_Ith_S(abstol, 1) = ATOL2;
  NV_Ith_S(abstol, 2) = ATOL3;

  /* Call CVodeCreate to create the solver memory and specify the
   * Backward Differentiation Formula */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  /* Call CVodeInit to initialize the integrator memory and specify the
   * user's right hand side function in y'=f(t,y), the initial time T0, and
   * the initial dependent variable vector y. */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  /* Call CVodeSVtolerances to specify the scalar relative tolerance
   * and vector absolute tolerances */
  retval = CVodeSVtolerances(cvode_mem, RTOL, abstol);
  if (check_retval(&retval, "CVodeSVtolerances", 1)) { return (1); }

  /* Call CVodeSetUserData to pass the check negative retval as user data */
  retval = CVodeSetUserData(cvode_mem, &check_negative);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  /* Create dense SUNMatrix for use in linear solves */
  A = SUNDenseMatrix(NEQ, NEQ, sunctx);
  if (check_retval((void*)A, "SUNDenseMatrix", 0)) { return (1); }

  /* Create dense SUNLinearSolver object for use by CVode */
  LS = SUNLinSol_Dense(y, A, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_Dense", 0)) { return (1); }

  /* Attach the matrix and linear solver */
  retval = CVodeSetLinearSolver(cvode_mem, LS, A);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return (1); }

  /* Case 1: ignore negative solution components */
  printf("Ignore negative solution components\n\n");
  check_negative = SUNFALSE;
  /* In loop, call CVode in CV_NORMAL mode */
  iout = 0;
  tout = T1;
  while (1)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    iout++;
    tout *= TMULT;
    if (iout == NOUT) { break; }
  }
  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* Case 2: intercept negative solution components */
  printf("Intercept negative solution components\n\n");
  check_negative = SUNTRUE;
  /* Reinitialize solver */
  NV_Ith_S(y, 0) = Y1;
  NV_Ith_S(y, 1) = Y2;
  NV_Ith_S(y, 2) = Y3;
  retval         = CVodeReInit(cvode_mem, T0, y);
  /* In loop, call CVode in CV_NORMAL mode */
  iout = 0;
  tout = T1;
  while (1)
  {
    CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    PrintOutput(t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2));
    iout++;
    tout *= TMULT;
    if (iout == NOUT) { break; }
  }
  /* Print some final statistics */
  PrintFinalStats(cvode_mem);

  /* Free memory */
  N_VDestroy(y);            /* Free y vector */
  N_VDestroy(abstol);       /* Free abstol vector */
  CVodeFree(&cvode_mem);    /* Free CVODE memory */
  SUNLinSolFree(LS);        /* Free the linear solver memory */
  SUNMatDestroy(A);         /* Free the matrix memory */
  SUNContext_Free(&sunctx); /* Free the SUNDIALS context */

  return (0);
}